

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

int btreeCursor(Btree *p,Pgno iTable,int wrFlag,KeyInfo *pKeyInfo,BtCursor *pCur)

{
  BtShared *pBt_00;
  int iVar1;
  Pgno PVar2;
  KeyInfo *in_RCX;
  int in_EDX;
  uint in_ESI;
  Btree *in_RDI;
  BtCursor *in_R8;
  BtCursor *pX;
  BtShared *pBt;
  BtCursor *pBVar3;
  Pgno local_14;
  
  pBt_00 = in_RDI->pBt;
  local_14 = in_ESI;
  if (in_ESI < 2) {
    if (in_ESI == 0) {
      iVar1 = sqlite3CorruptError(0);
      return iVar1;
    }
    PVar2 = btreePagecount(pBt_00);
    if (PVar2 == 0) {
      local_14 = 0;
    }
  }
  in_R8->pgnoRoot = local_14;
  in_R8->iPage = -1;
  in_R8->pKeyInfo = in_RCX;
  in_R8->pBtree = in_RDI;
  in_R8->pBt = pBt_00;
  in_R8->curFlags = '\0';
  for (pBVar3 = pBt_00->pCursor; pBVar3 != (BtCursor *)0x0; pBVar3 = pBVar3->pNext) {
    if (pBVar3->pgnoRoot == local_14) {
      pBVar3->curFlags = pBVar3->curFlags | 0x20;
      in_R8->curFlags = ' ';
    }
  }
  in_R8->eState = '\x01';
  in_R8->pNext = pBt_00->pCursor;
  pBt_00->pCursor = in_R8;
  if (in_EDX == 0) {
    in_R8->curPagerFlags = '\x02';
  }
  else {
    in_R8->curFlags = in_R8->curFlags | 1;
    in_R8->curPagerFlags = '\0';
    if (pBt_00->pTmpSpace == (u8 *)0x0) {
      iVar1 = allocateTempSpace((BtShared *)0x0);
      return iVar1;
    }
  }
  return 0;
}

Assistant:

static int btreeCursor(
  Btree *p,                              /* The btree */
  Pgno iTable,                           /* Root page of table to open */
  int wrFlag,                            /* 1 to write. 0 read-only */
  struct KeyInfo *pKeyInfo,              /* First arg to comparison function */
  BtCursor *pCur                         /* Space for new cursor */
){
  BtShared *pBt = p->pBt;                /* Shared b-tree handle */
  BtCursor *pX;                          /* Looping over other all cursors */

  assert( sqlite3BtreeHoldsMutex(p) );
  assert( wrFlag==0
       || wrFlag==BTREE_WRCSR
       || wrFlag==(BTREE_WRCSR|BTREE_FORDELETE)
  );

  /* The following assert statements verify that if this is a sharable
  ** b-tree database, the connection is holding the required table locks,
  ** and that no other connection has any open cursor that conflicts with
  ** this lock.  The iTable<1 term disables the check for corrupt schemas. */
  assert( hasSharedCacheTableLock(p, iTable, pKeyInfo!=0, (wrFlag?2:1))
          || iTable<1 );
  assert( wrFlag==0 || !hasReadConflicts(p, iTable) );

  /* Assert that the caller has opened the required transaction. */
  assert( p->inTrans>TRANS_NONE );
  assert( wrFlag==0 || p->inTrans==TRANS_WRITE );
  assert( pBt->pPage1 && pBt->pPage1->aData );
  assert( wrFlag==0 || (pBt->btsFlags & BTS_READ_ONLY)==0 );

  if( iTable<=1 ){
    if( iTable<1 ){
      return SQLITE_CORRUPT_BKPT;
    }else if( btreePagecount(pBt)==0 ){
      assert( wrFlag==0 );
      iTable = 0;
    }
  }

  /* Now that no other errors can occur, finish filling in the BtCursor
  ** variables and link the cursor into the BtShared list.  */
  pCur->pgnoRoot = iTable;
  pCur->iPage = -1;
  pCur->pKeyInfo = pKeyInfo;
  pCur->pBtree = p;
  pCur->pBt = pBt;
  pCur->curFlags = 0;
  /* If there are two or more cursors on the same btree, then all such
  ** cursors *must* have the BTCF_Multiple flag set. */
  for(pX=pBt->pCursor; pX; pX=pX->pNext){
    if( pX->pgnoRoot==iTable ){
      pX->curFlags |= BTCF_Multiple;
      pCur->curFlags = BTCF_Multiple;
    }
  }
  pCur->eState = CURSOR_INVALID;
  pCur->pNext = pBt->pCursor;
  pBt->pCursor = pCur;
  if( wrFlag ){
    pCur->curFlags |= BTCF_WriteFlag;
    pCur->curPagerFlags = 0;
    if( pBt->pTmpSpace==0 ) return allocateTempSpace(pBt);
  }else{
    pCur->curPagerFlags = PAGER_GET_READONLY;
  }
  return SQLITE_OK;
}